

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

void add_new_bb(gen_ctx_t gen_ctx,bb_t_conflict bb)

{
  uint uVar1;
  func_cfg_t pfVar2;
  bb_t pbVar3;
  DLIST_bb_t *pDVar4;
  
  if (bb != (bb_t_conflict)0x0) {
    pfVar2 = gen_ctx->curr_cfg;
    pbVar3 = (pfVar2->bbs).tail;
    if (pbVar3 == (bb_t)0x0) {
      pDVar4 = &pfVar2->bbs;
      if (pDVar4->head != (bb_t_conflict)0x0) goto LAB_00136c9b;
    }
    else {
      if ((pbVar3->bb_link).next != (bb_t)0x0) goto LAB_00136c9b;
      pDVar4 = (DLIST_bb_t *)&(pbVar3->bb_link).next;
    }
    pDVar4->head = bb;
    (bb->bb_link).next = (bb_t)0x0;
    (bb->bb_link).prev = pbVar3;
    (pfVar2->bbs).tail = bb;
    uVar1 = gen_ctx->curr_bb_index;
    gen_ctx->curr_bb_index = uVar1 + 1;
    bb->index = (ulong)uVar1;
    return;
  }
LAB_00136c9b:
  dlist_assert_fail("append","bb_t");
}

Assistant:

static void add_new_bb (gen_ctx_t gen_ctx, bb_t bb) {
  DLIST_APPEND (bb_t, curr_cfg->bbs, bb);
  bb->index = curr_bb_index++;
}